

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O2

action * get_shifts(int stateno)

{
  int iVar1;
  int iVar2;
  shifts *psVar3;
  action *paVar4;
  action *paVar5;
  ulong uVar6;
  
  psVar3 = shift_table[stateno];
  if (psVar3 == (shifts *)0x0) {
    paVar5 = (action *)0x0;
  }
  else {
    uVar6 = (ulong)(uint)psVar3->nshifts;
    paVar5 = (action *)0x0;
    while (0 < (int)uVar6) {
      iVar1 = psVar3->shift[uVar6 - 1];
      uVar6 = uVar6 - 1;
      iVar2 = accessing_symbol[iVar1];
      if (iVar2 < start_symbol) {
        paVar4 = (action *)allocate(0x18);
        paVar4->next = paVar5;
        paVar4->symbol = iVar2;
        paVar4->number = iVar1;
        paVar4->prec = symbol_prec[iVar2];
        paVar4->action_code = '\x01';
        paVar4->assoc = symbol_assoc[iVar2];
        paVar5 = paVar4;
      }
    }
  }
  return paVar5;
}

Assistant:

action *get_shifts(int stateno)
{
    register action *actions, *temp;
    register shifts *sp;
    register Yshort *to_state;
    register int i, k;
    register int symbol;

    actions = 0;
    sp = shift_table[stateno];
    if (sp)
    {
	to_state = sp->shift;
	for (i = sp->nshifts - 1; i >= 0; i--)
	{
	    k = to_state[i];
	    symbol = accessing_symbol[k];
	    if (ISTOKEN(symbol))
	    {
		temp = NEW(action);
		temp->next = actions;
		temp->symbol = symbol;
		temp->number = k;
		temp->prec = symbol_prec[symbol];
		temp->action_code = SHIFT;
		temp->assoc = symbol_assoc[symbol];
		actions = temp;
	    }
	}
    }
    return (actions);
}